

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

void __thiscall helics::InputInfo::removeSource(InputInfo *this,string_view sourceName,Time minTime)

{
  pointer pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pTVar2;
  int iVar3;
  pointer psVar4;
  pointer pdVar5;
  pointer *ppdVar6;
  size_t __n;
  ulong uVar7;
  size_type __rlen;
  
  __n = sourceName._M_len;
  (this->inputUnits)._M_string_length = 0;
  *(this->inputUnits)._M_dataplus._M_p = '\0';
  (this->inputType)._M_string_length = 0;
  *(this->inputType)._M_dataplus._M_p = '\0';
  psVar4 = (this->source_info).
           super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->source_info).
      super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    uVar7 = 0;
    do {
      if (psVar4[uVar7].key._M_string_length == __n) {
        if (__n != 0) {
          iVar3 = bcmp(sourceName._M_str,psVar4[uVar7].key._M_dataplus._M_p,__n);
          if (iVar3 != 0) goto LAB_00329484;
        }
        pvVar1 = (this->data_queues).
                 super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = *(pointer *)
                  ((long)&pvVar1[uVar7].
                          super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if (pvVar1[uVar7].
            super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
            ._M_impl.super__Vector_impl_data._M_start != pdVar5) {
          ppdVar6 = (pointer *)
                    ((long)&pvVar1[uVar7].
                            super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                            ._M_impl.super__Vector_impl_data + 8);
          do {
            if (pdVar5[-1].time.internalTimeCode <= minTime.internalTimeCode) break;
            *ppdVar6 = pdVar5 + -1;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      pdVar5[-1].data.
                      super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            pvVar1 = (this->data_queues).
                     super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar7;
            ppdVar6 = (pointer *)
                      ((long)&(pvVar1->
                              super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                              )._M_impl.super__Vector_impl_data + 8);
            pdVar5 = *ppdVar6;
          } while ((pvVar1->
                   super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                   )._M_impl.super__Vector_impl_data._M_start != pdVar5);
        }
        pTVar2 = (this->deactivated).
                 super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (minTime.internalTimeCode < pTVar2[uVar7].internalTimeCode) {
          pTVar2[uVar7].internalTimeCode = minTime.internalTimeCode;
        }
      }
LAB_00329484:
      uVar7 = uVar7 + 1;
      psVar4 = (this->source_info).
               super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(this->source_info).
                                    super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 5)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void InputInfo::removeSource(std::string_view sourceName, Time minTime)
{
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < source_info.size(); ++ii) {
        if (source_info[ii].key == sourceName) {
            while ((!data_queues[ii].empty()) && (data_queues[ii].back().time > minTime)) {
                data_queues[ii].pop_back();
            }
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}